

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SwapElements
          (Reflection *this,Message *message,FieldDescriptor *field,int index1,int index2)

{
  bool bVar1;
  uint32_t uVar2;
  CppStringType CVar3;
  RepeatedField<int> *this_00;
  RepeatedField<unsigned_long> *this_01;
  RepeatedField<absl::lts_20250127::Cord> *this_02;
  MapFieldBase *this_03;
  RepeatedPtrFieldBase *this_04;
  RepeatedField<long> *this_05;
  RepeatedField<unsigned_int> *this_06;
  RepeatedField<bool> *this_07;
  RepeatedField<double> *this_08;
  RepeatedField<float> *this_09;
  char *description;
  Descriptor *pDVar4;
  Metadata MVar5;
  
  MVar5 = Message::GetMetadata(message);
  if (MVar5.reflection != this) {
    pDVar4 = this->descriptor_;
    MVar5 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar4,MVar5.descriptor,field,"Swap");
  }
  pDVar4 = this->descriptor_;
  if (field->containing_type_ == pDVar4) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      if ((field->field_0x1 & 8) != 0) {
        uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        internal::ExtensionSet::SwapElements
                  ((ExtensionSet *)
                   ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                   field->number_,index1,index2);
        return;
      }
      switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
      case 1:
      case 8:
        this_00 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
        RepeatedField<int>::SwapElements(this_00,index1,index2);
        return;
      case 2:
        this_05 = MutableRaw<google::protobuf::RepeatedField<long>>(this,message,field);
        RepeatedField<long>::SwapElements(this_05,index1,index2);
        return;
      case 3:
        this_06 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
        RepeatedField<unsigned_int>::SwapElements(this_06,index1,index2);
        return;
      case 4:
        this_01 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
        RepeatedField<unsigned_long>::SwapElements(this_01,index1,index2);
        return;
      case 5:
        this_08 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message,field);
        RepeatedField<double>::SwapElements(this_08,index1,index2);
        return;
      case 6:
        this_09 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message,field);
        RepeatedField<float>::SwapElements(this_09,index1,index2);
        return;
      case 7:
        this_07 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
        RepeatedField<bool>::SwapElements(this_07,index1,index2);
        return;
      case 9:
        CVar3 = FieldDescriptor::cpp_string_type(field);
        if (CVar3 == kCord) {
          this_02 = MutableRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                              (this,message,field);
          RepeatedField<absl::lts_20250127::Cord>::SwapElements(this_02,index1,index2);
          return;
        }
switchD_001bf2d8_caseD_a:
        bVar1 = FieldDescriptor::is_map(field);
        if (bVar1) {
          this_03 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
          this_04 = internal::MapFieldBase::MutableRepeatedField(this_03);
        }
        else {
          this_04 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field)
          ;
        }
        internal::RepeatedPtrFieldBase::SwapElements(this_04,index1,index2);
        return;
      case 10:
        goto switchD_001bf2d8_caseD_a;
      default:
        return;
      }
    }
    pDVar4 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar4,field,"Swap",description);
}

Assistant:

void Reflection::SwapElements(Message* message, const FieldDescriptor* field,
                              int index1, int index2) const {
  USAGE_CHECK_MESSAGE(Swap, message);
  USAGE_CHECK_MESSAGE_TYPE(Swap);
  USAGE_CHECK_REPEATED(Swap);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SwapElements(field->number(), index1, index2);
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                 \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:              \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field) \
        ->SwapElements(index1, index2);                   \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          MutableRaw<RepeatedField<absl::Cord> >(message, field)
              ->SwapElements(index1, index2);
          break;
        }
        ABSL_FALLTHROUGH_INTENDED;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->SwapElements(index1, index2);
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->SwapElements(index1, index2);
        }
        break;
    }
  }
}